

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O0

bool CheatCheckList(event_t *ev,cheatseq_t *cheats,int numcheats)

{
  bool bVar1;
  int local_24;
  bool local_1d;
  int i;
  bool eat;
  cheatseq_t *pcStack_18;
  int numcheats_local;
  cheatseq_t *cheats_local;
  event_t *ev_local;
  
  local_1d = false;
  if (ev->type == '\x01') {
    i = numcheats;
    pcStack_18 = cheats;
    cheats_local = (cheatseq_t *)ev;
    for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
      bVar1 = CheatAddKey(pcStack_18,(BYTE)*(undefined2 *)((long)&cheats_local->Sequence + 4),
                          &local_1d);
      if (bVar1) {
        if ((pcStack_18->DontCheck != '\0') || (bVar1 = CheckCheatmode(true), !bVar1)) {
          bVar1 = (*pcStack_18->Handler)(pcStack_18);
          local_1d = (local_1d & 1U) != 0 || bVar1;
        }
      }
      else if (2 < (long)pcStack_18->Pos - (long)pcStack_18->Sequence) {
        local_1d = true;
      }
      pcStack_18 = pcStack_18 + 1;
    }
  }
  return (bool)(local_1d & 1);
}

Assistant:

static bool CheatCheckList (event_t *ev, cheatseq_t *cheats, int numcheats)
{
	bool eat = false;

	if (ev->type == EV_KeyDown)
	{
		int i;

		for (i = 0; i < numcheats; i++, cheats++)
		{
			if (CheatAddKey (cheats, (BYTE)ev->data2, &eat))
			{
				if (cheats->DontCheck || !CheckCheatmode ())
				{
					eat |= cheats->Handler (cheats);
				}
			}
			else if (cheats->Pos - cheats->Sequence > 2)
			{ // If more than two characters into the sequence,
			  // eat the keypress, just so that the Hexen cheats
			  // with T in them will work without unbinding T.
				eat = true;
			}
		}
	}
	return eat;
}